

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::BootstrapTest_OptionNotExist_Test::
BootstrapTest_OptionNotExist_Test(BootstrapTest_OptionNotExist_Test *this)

{
  BootstrapTest_OptionNotExist_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__BootstrapTest_OptionNotExist_Test_029ffff8;
  return;
}

Assistant:

TEST(BootstrapTest, OptionNotExist) {
  cpp::CppGenerator generator;
  DescriptorPool pool;
  GeneratorContext* generator_context = nullptr;
  std::string parameter = "aaa";
  std::string error;
  ASSERT_FALSE(generator.Generate(
      pool.FindFileByName("google/protobuf/descriptor.proto"), parameter,
      generator_context, &error));
  EXPECT_EQ(error, absl::StrCat("Unknown generator option: ", parameter));
}